

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O3

REF_STATUS ref_histogram_print(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid,char *description)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  char *__format;
  int iVar5;
  double dVar6;
  
  if ((long)ref_histogram->nbin < 1) {
    uVar4 = 0;
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + ref_histogram->bins[lVar3];
      lVar3 = lVar3 + 1;
    } while (ref_histogram->nbin != lVar3);
  }
  printf("%7.3f %10.3e min %s\n",ref_histogram->min,ref_histogram->min,description);
  uVar2 = (ulong)(uint)ref_histogram->nbin;
  if (0 < ref_histogram->nbin) {
    lVar3 = 0;
    do {
      iVar5 = (int)lVar3;
      dVar6 = exp2((double)((iVar5 - ((int)(((uint)(uVar2 >> 0x1f) & 1) + (int)uVar2) >> 1)) + 1) *
                   (1.0 / ref_histogram->exp));
      if ((ref_histogram->min <= dVar6 && dVar6 != ref_histogram->min) &&
         (dVar6 = exp2((double)(~(ref_histogram->nbin / 2) + iVar5) * (1.0 / ref_histogram->exp)),
         dVar6 < ref_histogram->max)) {
        dVar6 = exp2((double)(iVar5 - ref_histogram->nbin / 2) * (1.0 / ref_histogram->exp));
        pRVar1 = &ref_grid->adapt->split_ratio;
        if (((dVar6 < *pRVar1 || dVar6 == *pRVar1) &&
            (dVar6 = exp2((double)(~(ref_histogram->nbin / 2) + iVar5) * (1.0 / ref_histogram->exp))
            , ref_grid->adapt->collapse_ratio <= dVar6)) ||
           (__format = "%7.3f:%10d *\n", ref_histogram->bins[lVar3] < 1)) {
          __format = "%7.3f:%10d\n";
        }
        exp2((double)(iVar5 - ref_histogram->nbin / 2) * (1.0 / ref_histogram->exp));
        printf(__format,(ulong)(uint)ref_histogram->bins[lVar3]);
      }
      lVar3 = lVar3 + 1;
      uVar2 = (ulong)ref_histogram->nbin;
    } while (lVar3 < (long)uVar2);
  }
  printf("%7.3f %10.3e:%10d max %s\n",ref_histogram->max,ref_histogram->max,(ulong)uVar4,description
        );
  exp2(ref_histogram->log_total / (double)(int)uVar4);
  printf("%18.10f mean %s\n",description);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_print(REF_HISTOGRAM ref_histogram,
                                       REF_GRID ref_grid,
                                       const char *description) {
  REF_INT i, sum;
  REF_DBL log_mean;

  sum = 0;
  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    sum += ref_histogram_bin(ref_histogram, i);

  printf("%7.3f %10.3e min %s\n", ref_histogram_min(ref_histogram),
         ref_histogram_min(ref_histogram), description);

  for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
    if (ref_histogram_to_obs(i + 1) > ref_histogram_min(ref_histogram) &&
        ref_histogram_to_obs(i - 1) < ref_histogram_max(ref_histogram)) {
      if ((ref_histogram_to_obs(i) > ref_grid_adapt(ref_grid, split_ratio) ||
           ref_histogram_to_obs(i - 1) <
               ref_grid_adapt(ref_grid, collapse_ratio)) &&
          ref_histogram_bin(ref_histogram, i) > 0) {
        printf("%7.3f:%10d *\n", ref_histogram_to_obs(i),
               ref_histogram_bin(ref_histogram, i));
      } else {
        printf("%7.3f:%10d\n", ref_histogram_to_obs(i),
               ref_histogram_bin(ref_histogram, i));
      }
    }

  printf("%7.3f %10.3e:%10d max %s\n", ref_histogram_max(ref_histogram),
         ref_histogram_max(ref_histogram), sum, description);
  log_mean = ref_histogram_log_total(ref_histogram) / (REF_DBL)sum;
  printf("%18.10f mean %s\n", pow(2.0, log_mean), description);

  return REF_SUCCESS;
}